

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

void __thiscall despot::POMDPX::ComputeDefaultActions(POMDPX *this,string *type)

{
  ACT_TYPE AVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  int local_20;
  int s;
  int num_states;
  string *type_local;
  POMDPX *this_local;
  
  bVar2 = std::operator==(type,"MDP");
  if (!bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Unsupported default action type ");
    poVar6 = std::operator<<(poVar6,(string *)type);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  (*(this->super_MDP)._vptr_MDP[6])();
  iVar3 = (*(this->super_MDP)._vptr_MDP[2])();
  std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)iVar3);
  for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
    pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                       (&(this->super_MDP).policy_,(long)local_20);
    AVar1 = pvVar4->action;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->default_action_,(long)local_20);
    *pvVar5 = AVar1;
  }
  return;
}

Assistant:

void POMDPX::ComputeDefaultActions(string type) const {
	if (type == "MDP") {
		const_cast<POMDPX*>(this)->ComputeOptimalPolicyUsingVI();
		int num_states = NumStates();
		default_action_.resize(num_states);
		for (int s = 0; s < num_states; s++) {
			default_action_[s] = policy_[s].action;
		}
	} else {
		cerr << "Unsupported default action type " << type << endl;
		exit(0);
	}
}